

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void DeduceShortFunctionReturnValue
               (ExpressionContext *ctx,SynBase *source,FunctionData *function,
               IntrusiveList<ExprBase> *expressions)

{
  TypeBase *pTVar1;
  TypeBase *returnType;
  ExprBase *pEVar2;
  bool bVar3;
  int iVar4;
  ExprBase *pEVar5;
  TypeFunction *pTVar6;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  SynBase *pSVar9;
  ExprBase *pEVar7;
  
  if (function->hasExplicitReturn == false) {
    pTVar1 = function->type->returnType;
    if ((((pTVar1 != ctx->typeVoid) && (pEVar5 = expressions->tail, pEVar5 != (ExprBase *)0x0)) &&
        (returnType = pEVar5->type, returnType != ctx->typeVoid)) &&
       ((returnType == (TypeBase *)0x0 || (returnType->typeID != 0)))) {
      if (pTVar1 == ctx->typeAuto) {
        bVar3 = AssertValueExpression(ctx,pEVar5->source,pEVar5);
        if (!bVar3) {
          return;
        }
        pTVar6 = ExpressionContext::GetFunctionType(ctx,source,returnType,function->type->arguments)
        ;
        function->type = pTVar6;
      }
      else {
        pEVar5 = CreateCast(ctx,source,pEVar5,pTVar1,false);
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar4);
      pTVar1 = ctx->typeVoid;
      pEVar8 = CreateFunctionCoroutineStateUpdate(ctx,source,function,0);
      pSVar9 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pSVar9 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar9,function,ctx->scope);
      pEVar7->typeID = 0x1c;
      pEVar7->source = source;
      pEVar7->type = pTVar1;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240b60;
      pEVar7[1]._vptr_ExprBase = (_func_int **)pEVar5;
      *(ExprBase **)&pEVar7[1].typeID = pEVar8;
      pEVar7[1].source = pSVar9;
      pEVar5 = expressions->tail;
      pEVar8 = expressions->head;
      if (expressions->head == pEVar5) {
        expressions->tail = pEVar7;
        expressions->head = pEVar7;
      }
      else {
        while (pEVar2 = pEVar8, pEVar2 != (ExprBase *)0x0) {
          pEVar8 = pEVar2->next;
          if (pEVar2->next == pEVar5) {
            pEVar2->next = pEVar7;
            pEVar8 = pEVar7;
          }
        }
      }
      function->hasExplicitReturn = true;
    }
  }
  return;
}

Assistant:

void DeduceShortFunctionReturnValue(ExpressionContext &ctx, SynBase *source, FunctionData *function, IntrusiveList<ExprBase> &expressions)
{
	if(function->hasExplicitReturn)
		return;

	TypeBase *expected = function->type->returnType;

	if(expected == ctx.typeVoid)
		return;

	TypeBase *actual = expressions.tail ? expressions.tail->type : ctx.typeVoid;

	if(actual == ctx.typeVoid)
		return;

	if(isType<TypeError>(actual))
		return;

	ExprBase *result = expressions.tail;

	// If return type is auto, set it to type that is being returned
	if(expected == ctx.typeAuto)
	{
		if(result && !AssertValueExpression(ctx, result->source, result))
			return;

		function->type = ctx.GetFunctionType(source, actual, function->type->arguments);
	}
	else
	{
		result = CreateCast(ctx, source, expressions.tail, expected, false);
	}

	result = new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, source, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope));

	if(expressions.head == expressions.tail)
	{
		expressions.head = expressions.tail = result;
	}
	else
	{
		ExprBase *curr = expressions.head;

		while(curr)
		{
			if(curr->next == expressions.tail)
				curr->next = result;

			curr = curr->next;
		}
	}

	function->hasExplicitReturn = true;
}